

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  LogMessage *other;
  Type *pTVar3;
  int iVar4;
  LogMessage local_58;
  LogFinisher local_19;
  
  iVar4 = this->current_size_;
  if (iVar4 < 1) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x7ec);
    other = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_19,other);
    LogMessage::~LogMessage(&local_58);
    iVar4 = this->current_size_;
  }
  pRVar2 = this->rep_;
  this->current_size_ = iVar4 + -1;
  pTVar3 = (Type *)pRVar2->elements[(long)iVar4 + -1];
  iVar1 = pRVar2->allocated_size;
  pRVar2->allocated_size = iVar1 + -1;
  if (iVar4 < iVar1) {
    pRVar2->elements[(long)iVar4 + -1] = pRVar2->elements[(long)iVar1 + -1];
  }
  if (this->arena_ != (Arena *)0x0) {
    pTVar3 = (Type *)operator_new(0x20);
    (pTVar3->_M_dataplus)._M_p = (pointer)&pTVar3->field_2;
    pTVar3->_M_string_length = 0;
    (pTVar3->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)pTVar3);
  }
  return pTVar3;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseLastInternal(
    std::true_type) {
  // First, release an element.
  typename TypeHandler::Type* result = UnsafeArenaReleaseLast<TypeHandler>();
  // Now perform a copy if we're on an arena.
  Arena* arena = GetArena();
  if (arena == NULL) {
    return result;
  } else {
    typename TypeHandler::Type* new_result =
        TypeHandler::NewFromPrototype(result, NULL);
    TypeHandler::Merge(*result, new_result);
    return new_result;
  }
}